

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_pass(REF_GRID ref_grid)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  int cell;
  long lVar11;
  REF_NODE pRVar12;
  REF_INT tet0;
  REF_INT found;
  REF_INT tet1;
  REF_INT cell_nodes [4];
  REF_INT face_nodes [4];
  REF_INT found_nodes [27];
  REF_INT tri_nodes [27];
  int local_15c;
  int local_158;
  int local_154;
  REF_INT local_150;
  int local_14c;
  REF_INT local_148 [4];
  undefined8 local_138;
  undefined4 local_130;
  undefined4 local_12c;
  REF_NODE local_128;
  REF_GRID local_120;
  REF_INT local_118 [3];
  int local_10c;
  undefined8 local_a8;
  undefined4 local_a0;
  
  ref_cell = ref_grid->cell[3];
  if (0 < ref_cell->max) {
    pRVar12 = ref_grid->node;
    ref_cell_00 = ref_grid->cell[8];
    cell = 0;
    do {
      RVar5 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_a8);
      if (RVar5 == 0) {
        local_130 = local_a0;
        local_138 = local_a8;
        local_12c = (undefined4)local_a8;
        uVar6 = ref_cell_with_face(ref_cell_00,(REF_INT *)&local_138,&local_154,&local_14c);
        if (uVar6 != 0) {
          pcVar10 = "unable to find tets with face";
          uVar7 = 0xc6;
LAB_001c4f99:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 uVar7,"ref_swap_pass",(ulong)uVar6,pcVar10);
          return uVar6;
        }
        if ((long)local_154 == -1) {
          pcVar10 = "boundary tet missing";
          uVar7 = 199;
LAB_001c4f68:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 uVar7,"ref_swap_pass",pcVar10);
          return 1;
        }
        if (local_14c != -1) {
          pcVar10 = "boundary tri has two tets, not manifold";
          uVar7 = 200;
          goto LAB_001c4f68;
        }
        iVar1 = ref_grid->mpi->id;
        pRVar2 = pRVar12->part;
        pRVar3 = ref_cell_00->c2n;
        lVar8 = (long)ref_cell_00->size_per * (long)local_154;
        if ((((iVar1 == pRVar2[pRVar3[lVar8]]) && (iVar1 == pRVar2[pRVar3[lVar8 + 1]])) &&
            (iVar1 == pRVar2[pRVar3[lVar8 + 2]])) && (iVar1 == pRVar2[pRVar3[lVar8 + 3]])) {
          lVar11 = 0;
          local_158 = -1;
          lVar8 = 0;
          bVar4 = false;
          local_15c = -1;
          local_128 = pRVar12;
          local_120 = ref_grid;
          do {
            pRVar2 = ref_cell_00->c2n;
            iVar1 = ref_cell_00->size_per;
            pRVar3 = ref_cell_00->f2n;
            lVar9 = 0;
            do {
              local_148[lVar9] =
                   pRVar2[(long)*(int *)((long)pRVar3 + lVar9 * 4 + lVar11) +
                          (long)iVar1 * (long)local_154];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            RVar5 = ref_cell_with(ref_cell,local_148,&local_150);
            if (RVar5 == 0) {
              uVar6 = ref_cell_nodes(ref_cell,local_150,local_118);
              if (uVar6 != 0) {
                pcVar10 = "tri";
                uVar7 = 0xd9;
                goto LAB_001c4f99;
              }
              if (local_158 == -1) {
                local_158 = local_10c;
              }
              else {
                if (local_15c != -1) {
                  bVar4 = true;
                }
                local_15c = local_10c;
              }
            }
            ref_grid = local_120;
            pRVar12 = local_128;
            lVar8 = lVar8 + 1;
            lVar11 = lVar11 + 0x10;
          } while (lVar8 != 4);
          if (((local_15c != -1 && local_158 != -1) && (local_158 == local_15c)) &&
             ((!bVar4 && (uVar6 = ref_swap_remove_two_face_cell(local_120,local_154), uVar6 != 0))))
          {
            pcVar10 = "remove it";
            uVar7 = 0xe7;
            goto LAB_001c4f99;
          }
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_swap_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_INT tri_index, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, face_nodes[4];
  REF_INT tet0, tet1;
  REF_INT faceid0, faceid1;
  REF_BOOL more_than_two;
  REF_INT cell_face, node, cell_nodes[4];
  REF_INT found, found_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT rank;

  each_ref_cell_valid_cell_with_nodes(tri, tri_index, tri_nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = tri_nodes[i];
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(tet, face_nodes, &tet0, &tet1),
        "unable to find tets with face");
    if (REF_EMPTY == tet0) THROW("boundary tet missing");
    if (REF_EMPTY != tet1) THROW("boundary tri has two tets, not manifold");

    /* must be local to swap */
    rank = ref_mpi_rank(ref_grid_mpi(ref_grid));
    if (rank != ref_node_part(ref_node, ref_cell_c2n(tet, 0, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 1, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 2, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 3, tet0)))
      continue;

    faceid0 = REF_EMPTY;
    faceid1 = REF_EMPTY;
    more_than_two = REF_FALSE;
    for (cell_face = 0; cell_face < 4; cell_face++) {
      for (node = 0; node < 4; node++)
        cell_nodes[node] = ref_cell_f2n(tet, node, cell_face, tet0);
      if (REF_SUCCESS == ref_cell_with(tri, cell_nodes, &found)) {
        RSS(ref_cell_nodes(tri, found, found_nodes), "tri");
        if (REF_EMPTY == faceid0) {
          faceid0 = found_nodes[3];
        } else {
          if (REF_EMPTY != faceid1) {
            more_than_two = REF_TRUE;
          }
          faceid1 = found_nodes[3];
        }
      }
    }
    if (REF_EMPTY == faceid0 || REF_EMPTY == faceid1 || faceid0 != faceid1 ||
        more_than_two)
      continue;
    RSS(ref_swap_remove_two_face_cell(ref_grid, tet0), "remove it");
  }
  return REF_SUCCESS;
}